

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

int acutest_cmdline_callback_(int id,char *arg)

{
  acutest_test_data_ *paVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  
  if (id < 0x54) {
LAB_00105173:
    if (id < 0x43) {
      if (id < 0) {
        if (id == -0x7fffffff) {
          acutest_cmdline_callback__cold_3();
        }
        else if (id != -0x7ffffffe) {
          if (id != -0x7ffffffd) {
            return 0;
          }
          acutest_cmdline_callback__cold_1();
          goto LAB_001054b9;
        }
        acutest_cmdline_callback__cold_2();
        goto switchD_0010511b_caseD_6c;
      }
      if (id != 0) {
        return 0;
      }
      lVar8 = (long)acutest_list_size_;
      if (0 < lVar8) {
        lVar7 = 0;
        do {
          iVar2 = strcmp(*(char **)((long)&acutest_list_[0].name + lVar7),arg);
          paVar1 = acutest_test_data_;
          if (iVar2 == 0) {
            *(undefined4 *)((long)&acutest_test_data_->state + lVar7) = 0xfffffffd;
            return 0;
          }
          lVar7 = lVar7 + 0x10;
        } while (lVar8 << 4 != lVar7);
        lVar7 = 0;
        iVar2 = 0;
        do {
          pcVar6 = acutest_list_[lVar7].name;
          sVar3 = strlen(arg);
          for (pcVar4 = strstr(pcVar6,arg); pcVar4 != (char *)0x0; pcVar4 = strstr(pcVar4 + 1,arg))
          {
            bVar10 = true;
            bVar9 = true;
            if (pcVar4 != pcVar6) {
              pvVar5 = memchr(acutest_name_contains_word__word_delim,(int)pcVar4[-1],10);
              bVar9 = pvVar5 != (void *)0x0;
            }
            if (pcVar4[sVar3] != '\0') {
              pvVar5 = memchr(acutest_name_contains_word__word_delim,(int)pcVar4[sVar3],10);
              bVar10 = pvVar5 != (void *)0x0;
            }
            if ((bool)(bVar9 & bVar10)) {
              paVar1[lVar7].state = ACUTEST_STATE_SELECTED;
              iVar2 = iVar2 + 1;
              break;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar8);
        if (0 < iVar2) {
          return 0;
        }
        lVar7 = 0;
        do {
          pcVar6 = strstr(*(char **)((long)&acutest_list_[0].name + lVar7),arg);
          if (pcVar6 != (char *)0x0) {
            *(undefined4 *)((long)&paVar1->state + lVar7) = 0xfffffffd;
            iVar2 = iVar2 + 1;
          }
          lVar7 = lVar7 + 0x10;
        } while (lVar8 << 4 != lVar7);
        if (iVar2 != 0) {
          return 0;
        }
      }
      acutest_cmdline_callback__cold_4();
      id = (int)arg;
    }
    if (id != 0x43) {
      if (id == 0x45) {
        acutest_no_exec_ = 1;
        return 0;
      }
      if (id == 0x53) {
        acutest_no_summary_ = 1;
        return 0;
      }
      return 0;
    }
LAB_00105366:
    acutest_colorize_ = 0;
  }
  else {
    switch(id) {
    case 99:
      if ((arg == (char *)0x0) || (iVar2 = strcmp(arg,"always"), iVar2 == 0)) {
        acutest_colorize_ = 1;
        return 0;
      }
      iVar2 = strcmp(arg,"never");
      if (iVar2 != 0) {
        iVar2 = strcmp(arg,"auto");
        if (iVar2 == 0) {
          return 0;
        }
        pcVar6 = arg;
        acutest_cmdline_callback__cold_6();
        id = (int)pcVar6;
        goto LAB_00105173;
      }
      goto LAB_00105366;
    case 100:
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x72:
    case 0x73:
    case 0x75:
      break;
    case 0x65:
      if ((arg == (char *)0x0) || (iVar2 = strcmp(arg,"always"), iVar2 == 0)) {
        acutest_no_exec_ = 0;
        return 0;
      }
      iVar2 = strcmp(arg,"never");
      if (iVar2 == 0) {
        acutest_no_exec_ = 1;
        return 0;
      }
      iVar2 = strcmp(arg,"auto");
      if (iVar2 != 0) {
        acutest_cmdline_callback__cold_8();
        acutest_no_exec_ = 1;
        return 0;
      }
      return 0;
    case 0x68:
      acutest_help_();
      goto LAB_001054f4;
    case 0x6c:
switchD_0010511b_caseD_6c:
      acutest_list_names_();
LAB_001054f4:
      acutest_exit_(0);
    case 0x74:
      if ((arg == (char *)0x0) || (iVar2 = strcmp(arg,"real"), iVar2 == 0)) {
        acutest_timer_ = 1;
      }
      else {
        iVar2 = strcmp(arg,"cpu");
        if (iVar2 != 0) {
          acutest_cmdline_callback__cold_7();
        }
        acutest_timer_ = 2;
      }
      break;
    case 0x76:
      if (arg != (char *)0x0) {
        acutest_verbose_level_ = atoi(arg);
        return 0;
      }
LAB_001054b9:
      acutest_verbose_level_ = acutest_verbose_level_ + 1;
      break;
    case 0x77:
      acutest_worker_ = 1;
      acutest_worker_index_ = atoi(arg);
      break;
    case 0x78:
      acutest_xml_output_ = (FILE *)fopen(arg,"w");
      if ((FILE *)acutest_xml_output_ != (FILE *)0x0) {
        return 0;
      }
      acutest_cmdline_callback__cold_5();
    case 0x71:
      acutest_verbose_level_ = 0;
      break;
    default:
      if (id == 0x54) {
        acutest_tap_ = 1;
      }
      else if (id == 0x58) {
        acutest_exclude_mode_ = 1;
      }
    }
  }
  return 0;
}

Assistant:

static int
acutest_cmdline_callback_(int id, const char* arg)
{
    switch(id) {
        case 'X':
            acutest_exclude_mode_ = 1;
            break;

        case 'e':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                acutest_no_exec_ = 0;
            } else if(strcmp(arg, "never") == 0) {
                acutest_no_exec_ = 1;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --exec.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case 'E':
            acutest_no_exec_ = 1;
            break;

        case 't':
#if defined ACUTEST_WIN_  ||  defined ACUTEST_HAS_POSIX_TIMER_
            if(arg == NULL || strcmp(arg, "real") == 0) {
                acutest_timer_ = 1;
    #ifndef ACUTEST_WIN_
            } else if(strcmp(arg, "cpu") == 0) {
                acutest_timer_ = 2;
    #endif
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --time.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
#endif
            break;

        case 'S':
            acutest_no_summary_ = 1;
            break;

        case 'T':
            acutest_tap_ = 1;
            break;

        case 'l':
            acutest_list_names_();
            acutest_exit_(0);
            break;

        case 'v':
            acutest_verbose_level_ = (arg != NULL ? atoi(arg) : acutest_verbose_level_+1);
            break;

        case 'q':
            acutest_verbose_level_ = 0;
            break;

        case 'c':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                acutest_colorize_ = 1;
            } else if(strcmp(arg, "never") == 0) {
                acutest_colorize_ = 0;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --color.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case 'C':
            acutest_colorize_ = 0;
            break;

        case 'h':
            acutest_help_();
            acutest_exit_(0);
            break;

        case 'w':
            acutest_worker_ = 1;
            acutest_worker_index_ = atoi(arg);
            break;
        case 'x':
            acutest_xml_output_ = fopen(arg, "w");
            if (!acutest_xml_output_) {
                fprintf(stderr, "Unable to open '%s': %s\n", arg, strerror(errno));
                acutest_exit_(2);
            }
            break;

        case 0:
            if(acutest_select_(arg) == 0) {
                fprintf(stderr, "%s: Unrecognized unit test '%s'\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --list' for list of unit tests.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case ACUTEST_CMDLINE_OPTID_UNKNOWN_:
            fprintf(stderr, "Unrecognized command line option '%s'.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;

        case ACUTEST_CMDLINE_OPTID_MISSINGARG_:
            fprintf(stderr, "The command line option '%s' requires an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;

        case ACUTEST_CMDLINE_OPTID_BOGUSARG_:
            fprintf(stderr, "The command line option '%s' does not expect an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;
    }

    return 0;
}